

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_gradient_radial_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,float density,rf_color inner,
          rf_color outer,rf_color *dst,rf_int dst_size)

{
  char cVar1;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  int iVar17;
  rf_int x;
  long lVar18;
  rf_color *prVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  short sVar24;
  float fVar25;
  rf_color rVar27;
  undefined1 auVar29 [16];
  float fVar30;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar26;
  undefined6 uVar28;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (width * height * 4 <= dst_size) {
    iVar17 = height;
    if (width < height) {
      iVar17 = width;
    }
    lVar20 = (long)width;
    uVar13 = (ulong)outer._0_2_ & 0xffffffffffff00ff;
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar13;
    auVar7[0xc] = outer.a;
    auVar8[8] = outer.b;
    auVar8._0_8_ = uVar13;
    auVar8[9] = 0;
    auVar8._10_3_ = auVar7._10_3_;
    auVar15._5_8_ = 0;
    auVar15._0_5_ = auVar8._8_5_;
    auVar9[4] = outer.g;
    auVar9._0_4_ = (int)uVar13;
    auVar9[5] = 0;
    auVar9._6_7_ = SUB137(auVar15 << 0x40,6);
    uVar14 = (ulong)inner._0_2_ & 0xffffffffffff00ff;
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar14;
    auVar10[0xc] = inner.a;
    auVar11[8] = inner.b;
    auVar11._0_8_ = uVar14;
    auVar11[9] = 0;
    auVar11._10_3_ = auVar10._10_3_;
    auVar16._5_8_ = 0;
    auVar16._0_5_ = auVar11._8_5_;
    auVar12[4] = inner.g;
    auVar12._0_4_ = (int)uVar14;
    auVar12[5] = 0;
    auVar12._6_7_ = SUB137(auVar16 << 0x40,6);
    uVar21 = 0;
    lVar22 = 0;
    if (0 < lVar20) {
      lVar22 = lVar20;
    }
    uVar23 = 0;
    if (0 < height) {
      uVar23 = (ulong)(uint)height;
    }
    prVar19 = dst;
    for (; uVar21 != uVar23; uVar21 = uVar21 + 1) {
      for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
        fVar25 = hypotf((float)lVar18 - (float)width * 0.5,(float)(long)uVar21 - (float)height * 0.5
                       );
        fVar25 = (fVar25 + -((float)iVar17 * 0.5) * density) /
                 ((1.0 - density) * (float)iVar17 * 0.5);
        if (fVar25 <= 0.0) {
          fVar25 = 0.0;
        }
        if (1.0 <= fVar25) {
          fVar25 = 1.0;
        }
        fVar30 = 1.0 - fVar25;
        auVar29._0_4_ = (int)(fVar25 * (float)(int)uVar13 + fVar30 * (float)(int)uVar14);
        auVar29._4_4_ = (int)(fVar25 * (float)auVar9._4_4_ + fVar30 * (float)auVar12._4_4_);
        auVar29._8_4_ = (int)(fVar25 * (float)auVar8._8_4_ + fVar30 * (float)auVar11._8_4_);
        auVar29._12_4_ =
             (int)(fVar25 * (float)(uint3)(auVar7._10_3_ >> 0x10) +
                  fVar30 * (float)(uint3)(auVar10._10_3_ >> 0x10));
        auVar29 = auVar29 & _DAT_0016fd00;
        sVar5 = auVar29._0_2_;
        cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar29[0] - (0xff < sVar5);
        sVar5 = auVar29._2_2_;
        sVar24 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar29[2] - (0xff < sVar5),cVar1);
        sVar5 = auVar29._4_2_;
        cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar29[4] - (0xff < sVar5);
        sVar5 = auVar29._6_2_;
        uVar26 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar29[6] - (0xff < sVar5),
                          CONCAT12(cVar2,sVar24));
        sVar5 = auVar29._8_2_;
        cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar29[8] - (0xff < sVar5);
        sVar5 = auVar29._10_2_;
        uVar28 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar29[10] - (0xff < sVar5),
                          CONCAT14(cVar3,uVar26));
        sVar5 = auVar29._12_2_;
        cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar29[0xc] - (0xff < sVar5);
        sVar6 = auVar29._14_2_;
        sVar5 = (short)((uint)uVar26 >> 0x10);
        rVar27.g = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
        rVar27.r = (0 < sVar24) * (sVar24 < 0x100) * cVar1 - (0xff < sVar24);
        sVar5 = (short)((uint6)uVar28 >> 0x20);
        rVar27.b = (0 < sVar5) * (sVar5 < 0x100) * cVar3 - (0xff < sVar5);
        sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar29[0xe] - (0xff < sVar6),
                                 CONCAT16(cVar4,uVar28)) >> 0x30);
        rVar27.a = (0 < sVar5) * (sVar5 < 0x100) * cVar4 - (0xff < sVar5);
        prVar19[lVar18] = rVar27;
      }
      prVar19 = prVar19 + lVar20;
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_radial_to_buffer(int width, int height, float density, rf_color inner, rf_color outer, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float dist   = hypotf((float)x - center_x, (float)y - center_y);
                float factor = (dist - radius * density) / (radius * (1.0f - density));

                factor = (float)fmax(factor, 0.f);
                factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

                dst[y * width + x].r = (int)((float)outer.r * factor + (float)inner.r * (1.0f - factor));
                dst[y * width + x].g = (int)((float)outer.g * factor + (float)inner.g * (1.0f - factor));
                dst[y * width + x].b = (int)((float)outer.b * factor + (float)inner.b * (1.0f - factor));
                dst[y * width + x].a = (int)((float)outer.a * factor + (float)inner.a * (1.0f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}